

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O0

void __thiscall
Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>::~ProtoSignal
          (ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_> *this)

{
  char *in_RSI;
  ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_> *this_local;
  
  if (this->callback_ring_ != (SignalLink *)0x0) {
    while (this->callback_ring_->next != this->callback_ring_) {
      SignalLink::unlink(this->callback_ring_->next,in_RSI);
    }
    if (this->callback_ring_->ref_count < 2) {
      __assert_fail("callback_ring_->ref_count >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/SimpleSignal.h"
                    ,0x9a,
                    "Simple::Lib::ProtoSignal<bool (), Simple::CollectorUntil0<bool>>::~ProtoSignal()"
                   );
    }
    SignalLink::decref(this->callback_ring_);
    SignalLink::decref(this->callback_ring_);
  }
  return;
}

Assistant:

~ProtoSignal ()
  {
    if (callback_ring_)
      {
        while (callback_ring_->next != callback_ring_)
          callback_ring_->next->unlink();
        assert (callback_ring_->ref_count >= 2);
        callback_ring_->decref();
        callback_ring_->decref();
      }
  }